

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgDmaPutMem(uchar *mem,uint len)

{
  uint uVar1;
  ulong __n;
  
  uVar1 = 0x10;
  if ((ulong)ZvgIO.dmaCurCount < 0x8000) {
    __n = (ulong)(0x8000 - ZvgIO.dmaCurCount);
    if (ZvgIO.dmaCurCount + len < 0x8001) {
      __n = (ulong)len;
    }
    memcpy(ZvgIO.dmaCurP + ZvgIO.dmaCurCount,mem,__n);
    ZvgIO.dmaCurCount = ZvgIO.dmaCurCount + (int)__n;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint zvgDmaPutMem( uchar *mem, uint len)
{
	if (ZvgIO.dmaCurCount < MEM_BFR_SZ)
	{
		if ((ZvgIO.dmaCurCount + len) > MEM_BFR_SZ)
			len = MEM_BFR_SZ - ZvgIO.dmaCurCount;

		memcpy( &ZvgIO.dmaCurP[ZvgIO.dmaCurCount], mem, len);
		ZvgIO.dmaCurCount += len;
	}
	else
		return (errBfrFull);

	return (errOk);
}